

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_write_find_filter(png_structrp png_ptr,png_row_infop row_info)

{
  ulong uVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  png_bytep tptr;
  ulong uVar6;
  ulong uVar7;
  png_bytep ppVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  png_const_bytep ppVar12;
  long lVar13;
  uint uVar14;
  png_bytep ppVar15;
  png_bytep ppVar16;
  png_byte *ppVar17;
  byte *pbVar18;
  png_const_bytep ppVar19;
  byte *pbVar20;
  png_bytep ppVar21;
  byte *pbVar22;
  uint uVar23;
  uint uVar24;
  png_bytep ppVar25;
  uint uVar26;
  bool bVar27;
  png_bytep local_48;
  png_bytep local_40;
  
  bVar4 = png_ptr->do_filter;
  uVar1 = row_info->rowbytes;
  bVar5 = row_info->pixel_depth;
  ppVar12 = png_ptr->row_buf;
  if (uVar1 < 0x1ffffffffffffff) {
    uVar9 = 0xfffffffffffffeff;
    if (((bVar4 != 8 & bVar4 >> 3) == 1) && (uVar9 = 0, uVar1 != 0)) {
      uVar6 = 0;
      do {
        bVar3 = ppVar12[uVar6 + 1];
        uVar14 = 0x100 - bVar3;
        if (-1 < (char)bVar3) {
          uVar14 = (uint)bVar3;
        }
        uVar9 = uVar9 + uVar14;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  else {
    bVar4 = bVar4 & -bVar4;
    uVar9 = 0xfffffffffffffeff;
  }
  uVar14 = bVar5 + 7 >> 3;
  uVar6 = (ulong)uVar14;
  if (bVar4 == 0x10) {
    ppVar8 = png_ptr->try_row;
    *ppVar8 = '\x01';
    ppVar17 = ppVar8 + 1;
    ppVar12 = ppVar12 + 1;
    uVar7 = uVar6;
    ppVar19 = ppVar12;
    if (bVar5 == 0) {
      uVar11 = 0;
    }
    else {
      do {
        *ppVar17 = *ppVar19;
        ppVar17 = ppVar17 + 1;
        ppVar19 = ppVar19 + 1;
        uVar7 = uVar7 - 1;
        uVar11 = uVar6;
      } while (uVar7 != 0);
    }
    if (uVar11 < uVar1) {
      lVar13 = 0;
      do {
        ppVar17[lVar13] = ppVar19[lVar13] - ppVar12[lVar13];
        lVar13 = lVar13 + 1;
      } while (uVar1 - uVar11 != lVar13);
    }
    ppVar12 = png_ptr->try_row;
  }
  else if ((bVar4 & 0x10) != 0) {
    ppVar8 = png_ptr->try_row;
    *ppVar8 = '\x01';
    pbVar20 = ppVar8 + 1;
    pbVar18 = ppVar12 + 1;
    pbVar22 = pbVar18;
    if (bVar5 == 0) {
      uVar11 = 0;
      uVar7 = 0;
    }
    else {
      uVar11 = 0;
      uVar10 = uVar6;
      do {
        bVar3 = *pbVar22;
        *pbVar20 = bVar3;
        uVar23 = 0x100 - bVar3;
        if (-1 < (char)bVar3) {
          uVar23 = (uint)bVar3;
        }
        uVar11 = uVar11 + uVar23;
        pbVar20 = pbVar20 + 1;
        pbVar22 = pbVar22 + 1;
        uVar10 = uVar10 - 1;
        uVar7 = uVar6;
      } while (uVar10 != 0);
    }
    if (uVar7 < uVar1) {
      lVar13 = 0;
      do {
        bVar3 = pbVar22[lVar13] - pbVar18[lVar13];
        pbVar20[lVar13] = bVar3;
        uVar23 = 0x100 - bVar3;
        if (-1 < (char)bVar3) {
          uVar23 = (uint)bVar3;
        }
        uVar11 = uVar23 + uVar11;
      } while ((uVar11 <= uVar9) &&
              (uVar10 = uVar7 + 1 + lVar13, lVar13 = lVar13 + 1, uVar10 < uVar1));
    }
    if (uVar11 < uVar9) {
      ppVar12 = png_ptr->try_row;
      uVar9 = uVar11;
      if (png_ptr->tst_row != (png_bytep)0x0) {
        png_ptr->try_row = png_ptr->tst_row;
        png_ptr->tst_row = ppVar12;
      }
    }
  }
  if (bVar4 == 0x20) {
    ppVar8 = png_ptr->try_row;
    *ppVar8 = '\x02';
    if (uVar1 != 0) {
      ppVar25 = png_ptr->prev_row;
      ppVar21 = png_ptr->row_buf;
      uVar7 = 0;
      do {
        ppVar8[uVar7 + 1] = ppVar21[uVar7 + 1] - ppVar25[uVar7 + 1];
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    ppVar12 = png_ptr->try_row;
  }
  else if ((bVar4 & 0x20) != 0) {
    ppVar8 = png_ptr->try_row;
    *ppVar8 = '\x02';
    if (uVar1 == 0) {
      uVar7 = 0;
    }
    else {
      ppVar25 = png_ptr->prev_row;
      ppVar21 = png_ptr->row_buf;
      uVar7 = 0;
      uVar11 = 1;
      do {
        bVar3 = ppVar21[uVar11] - ppVar25[uVar11];
        ppVar8[uVar11] = bVar3;
        uVar23 = 0x100 - bVar3;
        if (-1 < (char)bVar3) {
          uVar23 = (uint)bVar3;
        }
        uVar7 = uVar23 + uVar7;
      } while ((uVar7 <= uVar9) && (bVar27 = uVar1 != uVar11, uVar11 = uVar11 + 1, bVar27));
    }
    if (uVar7 < uVar9) {
      ppVar12 = png_ptr->try_row;
      uVar9 = uVar7;
      if (png_ptr->tst_row != (png_bytep)0x0) {
        png_ptr->try_row = png_ptr->tst_row;
        png_ptr->tst_row = ppVar12;
      }
    }
  }
  if (bVar4 == 0x40) {
    ppVar8 = png_ptr->try_row;
    *ppVar8 = '\x03';
    ppVar8 = ppVar8 + 1;
    pbVar18 = png_ptr->prev_row + 1;
    ppVar21 = png_ptr->row_buf + 1;
    uVar7 = uVar6;
    ppVar25 = ppVar21;
    if (bVar5 == 0) {
      uVar11 = 0;
    }
    else {
      do {
        *ppVar8 = *ppVar25 - (*pbVar18 >> 1);
        ppVar8 = ppVar8 + 1;
        pbVar18 = pbVar18 + 1;
        ppVar25 = ppVar25 + 1;
        uVar14 = (int)uVar7 - 1;
        uVar7 = (ulong)uVar14;
        uVar11 = uVar6;
      } while (uVar14 != 0);
    }
    if (uVar11 < uVar1) {
      lVar13 = 0;
      do {
        ppVar8[lVar13] =
             ppVar25[lVar13] - (char)((uint)ppVar21[lVar13] + (uint)pbVar18[lVar13] >> 1);
        iVar2 = (int)lVar13;
        lVar13 = lVar13 + 1;
      } while ((uint)((int)uVar11 + 1 + iVar2) < uVar1);
    }
    ppVar12 = png_ptr->try_row;
  }
  else if ((bVar4 & 0x40) != 0) {
    ppVar8 = png_ptr->try_row;
    *ppVar8 = '\x03';
    pbVar18 = ppVar8 + 1;
    pbVar22 = png_ptr->prev_row + 1;
    ppVar25 = png_ptr->row_buf + 1;
    ppVar8 = ppVar25;
    if (bVar5 == 0) {
      uVar14 = 0;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      uVar11 = uVar6;
      do {
        bVar3 = *ppVar8 - (*pbVar22 >> 1);
        *pbVar18 = bVar3;
        uVar23 = 0x100 - bVar3;
        if (-1 < (char)bVar3) {
          uVar23 = (uint)bVar3;
        }
        uVar7 = uVar7 + uVar23;
        pbVar18 = pbVar18 + 1;
        pbVar22 = pbVar22 + 1;
        ppVar8 = ppVar8 + 1;
        uVar23 = (int)uVar11 - 1;
        uVar11 = (ulong)uVar23;
      } while (uVar23 != 0);
    }
    if (uVar14 < uVar1) {
      lVar13 = 0;
      do {
        bVar3 = ppVar8[lVar13] - (char)((uint)ppVar25[lVar13] + (uint)pbVar22[lVar13] >> 1);
        pbVar18[lVar13] = bVar3;
        uVar23 = 0x100 - bVar3;
        if (-1 < (char)bVar3) {
          uVar23 = (uint)bVar3;
        }
        uVar7 = uVar23 + uVar7;
      } while ((uVar7 <= uVar9) &&
              (iVar2 = (int)lVar13, lVar13 = lVar13 + 1, uVar14 + 1 + iVar2 < uVar1));
    }
    if (uVar7 < uVar9) {
      ppVar12 = png_ptr->try_row;
      uVar9 = uVar7;
      if (png_ptr->tst_row != (png_bytep)0x0) {
        png_ptr->try_row = png_ptr->tst_row;
        png_ptr->tst_row = ppVar12;
      }
    }
  }
  if (bVar4 == 0x80) {
    ppVar8 = png_ptr->try_row;
    *ppVar8 = '\x04';
    ppVar8 = ppVar8 + 1;
    ppVar25 = png_ptr->prev_row + 1;
    ppVar21 = png_ptr->row_buf + 1;
    if (bVar5 == 0) {
      uVar6 = 0;
      ppVar15 = ppVar25;
      ppVar16 = ppVar21;
    }
    else {
      uVar9 = 0;
      do {
        ppVar8[uVar9] = ppVar21[uVar9] - ppVar25[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
      ppVar8 = ppVar8 + uVar9;
      ppVar15 = ppVar25 + uVar9;
      ppVar16 = ppVar21 + uVar9;
    }
    if (uVar6 < uVar1) {
      lVar13 = 0;
      do {
        bVar4 = ppVar25[lVar13];
        uVar23 = (uint)ppVar15[lVar13] - (uint)bVar4;
        uVar24 = (uint)ppVar21[lVar13] - (uint)bVar4;
        uVar14 = -uVar23;
        if (0 < (int)uVar23) {
          uVar14 = uVar23;
        }
        uVar26 = -uVar24;
        if (0 < (int)uVar24) {
          uVar26 = uVar24;
        }
        uVar24 = uVar24 + uVar23;
        uVar23 = -uVar24;
        if (0 < (int)uVar24) {
          uVar23 = uVar24;
        }
        if ((uVar26 & 0xff) <= uVar23) {
          bVar4 = ppVar15[lVar13];
        }
        bVar5 = ppVar21[lVar13];
        if (uVar23 < (uVar14 & 0xff)) {
          bVar5 = bVar4;
        }
        if ((uVar26 & 0xff) < (uVar14 & 0xff)) {
          bVar5 = bVar4;
        }
        ppVar8[lVar13] = ppVar16[lVar13] - bVar5;
        lVar13 = lVar13 + 1;
      } while (uVar1 - uVar6 != lVar13);
    }
    ppVar12 = png_ptr->try_row;
  }
  else if ((char)bVar4 < '\0') {
    ppVar8 = png_ptr->try_row;
    *ppVar8 = '\x04';
    ppVar8 = ppVar8 + 1;
    ppVar21 = png_ptr->prev_row + 1;
    ppVar25 = png_ptr->row_buf + 1;
    if (bVar5 == 0) {
      uVar6 = 0;
      uVar7 = 0;
      local_48 = ppVar25;
      local_40 = ppVar21;
    }
    else {
      uVar7 = 0;
      uVar11 = 0;
      do {
        bVar4 = ppVar25[uVar11] - ppVar21[uVar11];
        uVar14 = 0x100 - bVar4;
        if (-1 < (char)bVar4) {
          uVar14 = (uint)bVar4;
        }
        ppVar8[uVar11] = bVar4;
        uVar7 = uVar7 + uVar14;
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
      ppVar8 = ppVar8 + uVar11;
      local_48 = ppVar25 + uVar11;
      local_40 = ppVar21 + uVar11;
    }
    if (uVar6 < uVar1) {
      lVar13 = 0;
      do {
        bVar4 = ppVar21[lVar13];
        uVar24 = (uint)local_40[lVar13] - (uint)bVar4;
        uVar23 = (uint)ppVar25[lVar13] - (uint)bVar4;
        uVar14 = -uVar24;
        if (0 < (int)uVar24) {
          uVar14 = uVar24;
        }
        uVar26 = -uVar23;
        if (0 < (int)uVar23) {
          uVar26 = uVar23;
        }
        uVar23 = uVar23 + uVar24;
        uVar24 = -uVar23;
        if (0 < (int)uVar23) {
          uVar24 = uVar23;
        }
        if ((uVar26 & 0xff) <= uVar24) {
          bVar4 = local_40[lVar13];
        }
        bVar5 = ppVar25[lVar13];
        if (uVar24 < (uVar14 & 0xff)) {
          bVar5 = bVar4;
        }
        if ((uVar26 & 0xff) < (uVar14 & 0xff)) {
          bVar5 = bVar4;
        }
        bVar5 = local_48[lVar13] - bVar5;
        ppVar8[lVar13] = bVar5;
        uVar14 = 0x100 - bVar5;
        if (-1 < (char)bVar5) {
          uVar14 = (uint)bVar5;
        }
        uVar7 = uVar7 + uVar14;
      } while ((uVar7 <= uVar9) &&
              (uVar11 = uVar6 + 1 + lVar13, lVar13 = lVar13 + 1, uVar11 < uVar1));
    }
    if (uVar7 < uVar9) {
      ppVar12 = png_ptr->try_row;
      if (png_ptr->tst_row != (png_bytep)0x0) {
        png_ptr->try_row = png_ptr->tst_row;
        png_ptr->tst_row = ppVar12;
      }
    }
  }
  png_compress_IDAT(png_ptr,ppVar12,row_info->rowbytes + 1,0);
  ppVar8 = png_ptr->prev_row;
  if (ppVar8 != (png_bytep)0x0) {
    png_ptr->prev_row = png_ptr->row_buf;
    png_ptr->row_buf = ppVar8;
  }
  png_write_finish_row(png_ptr);
  uVar14 = png_ptr->flush_rows + 1;
  png_ptr->flush_rows = uVar14;
  if (uVar14 <= png_ptr->flush_dist - 1) {
    return;
  }
  png_write_flush(png_ptr);
  return;
}

Assistant:

void /* PRIVATE */
png_write_find_filter(png_structrp png_ptr, png_row_infop row_info)
{
#ifndef PNG_WRITE_FILTER_SUPPORTED
   png_write_filtered_row(png_ptr, png_ptr->row_buf, row_info->rowbytes+1);
#else
   unsigned int filter_to_do = png_ptr->do_filter;
   png_bytep row_buf;
   png_bytep best_row;
   png_uint_32 bpp;
   size_t mins;
   size_t row_bytes = row_info->rowbytes;

   png_debug(1, "in png_write_find_filter");

   /* Find out how many bytes offset each pixel is */
   bpp = (row_info->pixel_depth + 7) >> 3;

   row_buf = png_ptr->row_buf;
   mins = PNG_SIZE_MAX - 256/* so we can detect potential overflow of the
                               running sum */;

   /* The prediction method we use is to find which method provides the
    * smallest value when summing the absolute values of the distances
    * from zero, using anything >= 128 as negative numbers.  This is known
    * as the "minimum sum of absolute differences" heuristic.  Other
    * heuristics are the "weighted minimum sum of absolute differences"
    * (experimental and can in theory improve compression), and the "zlib
    * predictive" method (not implemented yet), which does test compressions
    * of lines using different filter methods, and then chooses the
    * (series of) filter(s) that give minimum compressed data size (VERY
    * computationally expensive).
    *
    * GRR 980525:  consider also
    *
    *   (1) minimum sum of absolute differences from running average (i.e.,
    *       keep running sum of non-absolute differences & count of bytes)
    *       [track dispersion, too?  restart average if dispersion too large?]
    *
    *  (1b) minimum sum of absolute differences from sliding average, probably
    *       with window size <= deflate window (usually 32K)
    *
    *   (2) minimum sum of squared differences from zero or running average
    *       (i.e., ~ root-mean-square approach)
    */


   /* We don't need to test the 'no filter' case if this is the only filter
    * that has been chosen, as it doesn't actually do anything to the data.
    */
   best_row = png_ptr->row_buf;

   if (PNG_SIZE_MAX/128 <= row_bytes)
   {
      /* Overflow can occur in the calculation, just select the lowest set
       * filter.
       */
      filter_to_do &= 0U-filter_to_do;
   }
   else if ((filter_to_do & PNG_FILTER_NONE) != 0 &&
         filter_to_do != PNG_FILTER_NONE)
   {
      /* Overflow not possible and multiple filters in the list, including the
       * 'none' filter.
       */
      png_bytep rp;
      size_t sum = 0;
      size_t i;
      unsigned int v;

      {
         for (i = 0, rp = row_buf + 1; i < row_bytes; i++, rp++)
         {
            v = *rp;
#ifdef PNG_USE_ABS
            sum += 128 - abs((int)v - 128);
#else
            sum += (v < 128) ? v : 256 - v;
#endif
         }
      }

      mins = sum;
   }

   /* Sub filter */
   if (filter_to_do == PNG_FILTER_SUB)
   /* It's the only filter so no testing is needed */
   {
      png_setup_sub_row_only(png_ptr, bpp, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_SUB) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum = png_setup_sub_row(png_ptr, bpp, row_bytes, lmins);

      if (sum < mins)
      {
         mins = sum;
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Up filter */
   if (filter_to_do == PNG_FILTER_UP)
   {
      png_setup_up_row_only(png_ptr, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_UP) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum = png_setup_up_row(png_ptr, row_bytes, lmins);

      if (sum < mins)
      {
         mins = sum;
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Avg filter */
   if (filter_to_do == PNG_FILTER_AVG)
   {
      png_setup_avg_row_only(png_ptr, bpp, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_AVG) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum= png_setup_avg_row(png_ptr, bpp, row_bytes, lmins);

      if (sum < mins)
      {
         mins = sum;
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Paeth filter */
   if (filter_to_do == PNG_FILTER_PAETH)
   {
      png_setup_paeth_row_only(png_ptr, bpp, row_bytes);
      best_row = png_ptr->try_row;
   }

   else if ((filter_to_do & PNG_FILTER_PAETH) != 0)
   {
      size_t sum;
      size_t lmins = mins;

      sum = png_setup_paeth_row(png_ptr, bpp, row_bytes, lmins);

      if (sum < mins)
      {
         best_row = png_ptr->try_row;
         if (png_ptr->tst_row != NULL)
         {
            png_ptr->try_row = png_ptr->tst_row;
            png_ptr->tst_row = best_row;
         }
      }
   }

   /* Do the actual writing of the filtered row data from the chosen filter. */
   png_write_filtered_row(png_ptr, best_row, row_info->rowbytes+1);

#endif /* WRITE_FILTER */
}